

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corealloc.h
# Opt level: O3

void __thiscall
snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::
Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>,void>
          (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>> *this,
          Range<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>_>
          *spare)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>> *pAVar4;
  undefined1 auVar5 [16];
  
  memset(this,0,0x169);
  lVar3 = 0x170;
  do {
    *(undefined8 *)(this + lVar3) = 0;
    *(undefined8 *)(this + lVar3 + 8) = 0;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x1970);
  lVar3 = 0x1970;
  do {
    *(undefined8 *)(this + lVar3) = 0;
    *(undefined8 *)(this + lVar3 + 8) = 0;
    *(undefined2 *)(this + lVar3 + 0x10) = 0;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x1af0);
  memset(this + 0x1af0,0,0x88);
  lVar3 = 0x1b78;
  do {
    *(Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>> **)
     (this + lVar3) = this + lVar3;
    *(Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>> **)
     (this + lVar3 + 8) = this + lVar3;
    *(undefined4 *)(this + lVar3 + 0x10) = 0;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x1f80);
  *(Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>> **)
   (this + 0x1f80) = this + 0x1f80;
  *(Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>> **)
   (this + 0x1f88) = this + 0x1f80;
  *(undefined8 *)(this + 0x1f90) = 0;
  *(undefined8 *)(this + 0x1f98) = 0;
  *(undefined8 *)(this + 0x1fa0) = 0;
  *(undefined8 *)(this + 0x1fa8) = 0;
  lVar3 = 0;
  *(undefined8 *)(this + 0x1fb0) = 0;
  *(undefined8 *)(this + 0x2000) = 0;
  *(undefined8 *)(this + 0x2040) = 0;
  memset(this + 0x2100,0,0xf0);
  auVar2 = _DAT_0010d010;
  auVar1 = _DAT_0010d000;
  pAVar4 = this + 0x2148;
  do {
    auVar5._8_4_ = (int)lVar3;
    auVar5._0_8_ = lVar3;
    auVar5._12_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar5 = (auVar5 | auVar1) ^ auVar2;
    if (auVar5._4_4_ == -0x80000000 && auVar5._0_4_ < -0x7ffffff9) {
      *(undefined8 *)(pAVar4 + -0x20) = 0;
      *(undefined8 *)pAVar4 = 0;
    }
    lVar3 = lVar3 + 2;
    pAVar4 = pAVar4 + 0x40;
  } while (lVar3 != 8);
  memset(this + 0x21f0,0,0x148);
  lVar3 = 0x21f8;
  do {
    *(undefined1 (*) [16])(this + lVar3) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(this + lVar3 + 0x10) = (undefined1  [16])0x0;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x2338);
  *(undefined8 *)(this + 0x2338) = 0;
  *(undefined8 *)(this + 0x2340) = 1;
  *(undefined8 *)(this + 0x2348) = 1;
  *(undefined8 *)(this + 0x2350) = 0;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::init
            ((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
             this,(EVP_PKEY_CTX *)spare);
  return;
}

Assistant:

Allocator(Range<capptr::bounds::Alloc>& spare)
    {
      init(spare);
    }